

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

void bcf_hrec_destroy(bcf_hrec_t *hrec)

{
  long lVar1;
  
  free(hrec->key);
  if (hrec->value != (char *)0x0) {
    free(hrec->value);
  }
  if (0 < hrec->nkeys) {
    lVar1 = 0;
    do {
      free(hrec->keys[lVar1]);
      free(hrec->vals[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < hrec->nkeys);
  }
  free(hrec->keys);
  free(hrec->vals);
  free(hrec);
  return;
}

Assistant:

void bcf_hrec_destroy(bcf_hrec_t *hrec)
{
    free(hrec->key);
    if ( hrec->value ) free(hrec->value);
    int i;
    for (i=0; i<hrec->nkeys; i++)
    {
        free(hrec->keys[i]);
        free(hrec->vals[i]);
    }
    free(hrec->keys);
    free(hrec->vals);
    free(hrec);
}